

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportInvalidTestSuiteType
               (char *test_suite_name,CodeLocation *code_location)

{
  Message *pMVar1;
  ostream *poVar2;
  internal *this;
  int line;
  string local_70;
  string local_50;
  GTestLog local_30 [4];
  Message local_20;
  Message errors;
  CodeLocation *code_location_local;
  char *test_suite_name_local;
  
  errors.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )code_location;
  code_location_local = (CodeLocation *)test_suite_name;
  Message::Message(&local_20);
  pMVar1 = Message::operator<<(&local_20,(char (*) [38])"Attempted redefinition of test suite ");
  pMVar1 = Message::operator<<(pMVar1,(char **)&code_location_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x1d0ccb);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [65])
                                      "All tests in the same test suite must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [32])"class.  However, in test suite ");
  pMVar1 = Message::operator<<(pMVar1,(char **)&code_location_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [13])0x1d09e1);
  line = 0xadd;
  GTestLog::GTestLog(local_30,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O0/_deps/googletest-src/googletest/src/gtest.cc"
                     ,0xadd);
  poVar2 = GTestLog::GetStream(local_30);
  this = (internal *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   (&code_location->file);
  FormatFileLocation_abi_cxx11_(&local_50,this,(char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2," ");
  Message::GetString_abi_cxx11_(&local_70,&local_20);
  std::operator<<(poVar2,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  GTestLog::~GTestLog(local_30);
  Message::~Message(&local_20);
  return;
}

Assistant:

void ReportInvalidTestSuiteType(const char* test_suite_name,
                                CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test suite " << test_suite_name << ".\n"
      << "All tests in the same test suite must use the same test fixture\n"
      << "class.  However, in test suite " << test_suite_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test suites.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}